

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::operator<<(ostream *s,
                           DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *m)

{
  ostream *poVar1;
  allocator local_1d6;
  allocator local_1d5;
  allocator local_1d4;
  allocator local_1d3;
  allocator local_1d2;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  IOFormat local_110;
  
  std::__cxx11::string::string((string *)&local_190," ",&local_1d1);
  std::__cxx11::string::string((string *)&local_1b0,"\n",&local_1d2);
  std::__cxx11::string::string((string *)&local_1d0,"",&local_1d3);
  std::__cxx11::string::string((string *)&local_130,"",&local_1d4);
  std::__cxx11::string::string((string *)&local_150,"",&local_1d5);
  std::__cxx11::string::string((string *)&local_170,"",&local_1d6);
  IOFormat::IOFormat(&local_110,-1,0,&local_190,&local_1b0,&local_1d0,&local_130,&local_150,
                     &local_170);
  poVar1 = internal::print_matrix<Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
                     (s,(Matrix<std::complex<double>,__1,_1,_0,__1,_1> *)m,&local_110);
  IOFormat::~IOFormat(&local_110);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}